

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HTTPResponse * processPhp(HTTPRequest *req)

{
  bool bVar1;
  undefined1 *puVar2;
  char *pcVar3;
  long in_RSI;
  HTTPResponse *in_RDI;
  bool in_stack_0000002f;
  string *in_stack_00000030;
  string *in_stack_00000038;
  string *in_stack_00000040;
  int in_stack_0000004c;
  HTTPResponse *in_stack_00000050;
  string headers;
  size_type pos;
  lock_guard<std::mutex> guard;
  string output;
  string fullPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffdb8;
  string *this;
  lock_guard<std::mutex> *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffdf0;
  key_type *in_stack_fffffffffffffdf8;
  mapped_type *in_stack_fffffffffffffe00;
  allocator<char> local_1a1;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [8];
  char *in_stack_fffffffffffffea8;
  string local_138 [39];
  allocator<char> local_111;
  string local_110 [40];
  string local_e8 [39];
  undefined1 local_c1 [40];
  allocator<char> local_99;
  string local_98 [32];
  _Self local_78;
  allocator<char> local_69;
  string local_68 [32];
  _Self local_48 [2];
  string *in_stack_ffffffffffffffc8;
  string *in_stack_ffffffffffffffd0;
  
  exec_abi_cxx11_(in_stack_fffffffffffffea8);
  puVar2 = (undefined1 *)std::__cxx11::string::back();
  *puVar2 = 0x2f;
  std::__cxx11::string::operator+=((string *)&stack0xffffffffffffffd0,(string *)(in_RSI + 0x20));
  setenv("GATEWAY_INTERFACE","CGI/1.1",1);
  setenv("REDIRECT_STATUS","200",1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  setenv("REQUEST_METHOD",pcVar3,1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  setenv("SCRIPT_FILENAME",pcVar3,1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  setenv("SCRIPT_NAME",pcVar3,1);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  setenv("QUERY_STRING",pcVar3,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  local_48[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(in_stack_fffffffffffffdb8,(key_type *)0x105912);
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_fffffffffffffdb8);
  bVar1 = std::operator!=(local_48,&local_78);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0
              );
    in_stack_fffffffffffffe00 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    setenv("CONTENT_TYPE",pcVar3,1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    in_stack_fffffffffffffdf0 = (allocator<char> *)(in_RSI + 0x60);
    in_stack_fffffffffffffdf8 = (key_type *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0
              );
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    setenv("CONTENT_LENGTH",pcVar3,1);
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
  }
  std::__cxx11::string::string(local_e8);
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffdc0,(mutex_type *)in_stack_fffffffffffffdb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  writeFile(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  exec_abi_cxx11_(in_stack_fffffffffffffea8);
  std::__cxx11::string::operator=(local_e8,local_138);
  std::__cxx11::string::~string(local_138);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x105c6a);
  std::__cxx11::string::find((char *)local_e8,0x10f391);
  std::__cxx11::string::substr((ulong)local_160,(ulong)local_e8);
  std::__cxx11::string::substr((ulong)local_180,(ulong)local_e8);
  this = local_180;
  std::__cxx11::string::operator=(local_e8,this);
  std::__cxx11::string::~string(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  HTTPResponse::HTTPResponse
            (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_00000038,
             in_stack_00000030,in_stack_0000002f);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_e8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  return in_RDI;
}

Assistant:

HTTPResponse processPhp(HTTPRequest& req)
{
    std::string fullPath = exec("pwd");
    fullPath.back() = '/';
    fullPath += req.filepath;

    setenv("GATEWAY_INTERFACE", "CGI/1.1", 1);
    setenv("REDIRECT_STATUS", "200", 1);

    setenv("REQUEST_METHOD", req.method.c_str(), 1);
    setenv("SCRIPT_FILENAME", fullPath.c_str(), 1);
    setenv("SCRIPT_NAME", req.filepath.c_str(), 1);
    setenv("QUERY_STRING", req.query.c_str(), 1);

    if (req.headers.find("Content-Length") != req.headers.end())
    {
        setenv("CONTENT_TYPE", req.headers["Content-Type"].c_str(), 1);
        setenv("CONTENT_LENGTH", req.headers["Content-Length"].c_str(), 1);
    }

    string output;
    {
        lock_guard<mutex> guard(phpInputFileMutex);

        writeFile("input.txt", req.body);

        #ifdef USE_PHP_FPM
        output = exec("cgi-fcgi < input.txt -bind -connect /var/run/php/php-fpm.sock");
        #else
        output = exec("php-cgi < input.txt");
        #endif  
    }

    auto pos = output.find("\n");
    string headers = output.substr(0, pos);
    output = output.substr(pos);

    return HTTPResponse(200, "OK", headers, output, true);
}